

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_io.c
# Opt level: O0

int KINSetEtaConstValue(void *kinmem,sunrealtype eta)

{
  KINMem in_RDI;
  double in_XMM0_Qa;
  KINMem kin_mem;
  int local_4;
  
  if (in_RDI == (KINMem)0x0) {
    KINProcessError((KINMem)0x0,-1,0x1be,"KINSetEtaConstValue",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol_io.c"
                    ,"kinsol_mem = NULL illegal.");
    local_4 = -1;
  }
  else if ((in_XMM0_Qa < 0.0) || (1.0 < in_XMM0_Qa)) {
    KINProcessError(in_RDI,-2,0x1c6,"KINSetEtaConstValue",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol_io.c"
                    ,"eta out of range.");
    local_4 = -2;
  }
  else {
    if ((in_XMM0_Qa != 0.0) || (NAN(in_XMM0_Qa))) {
      in_RDI->kin_eta = in_XMM0_Qa;
    }
    else {
      in_RDI->kin_eta = 0.1;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int KINSetEtaConstValue(void* kinmem, sunrealtype eta)
{
  KINMem kin_mem;

  if (kinmem == NULL)
  {
    KINProcessError(NULL, KIN_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (KIN_MEM_NULL);
  }

  kin_mem = (KINMem)kinmem;

  if ((eta < ZERO) || (eta > ONE))
  {
    KINProcessError(kin_mem, KIN_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_BAD_ETACONST);
    return (KIN_ILL_INPUT);
  }

  if (eta == ZERO) { kin_mem->kin_eta = POINT1; }
  else { kin_mem->kin_eta = eta; }

  return (KIN_SUCCESS);
}